

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line.hpp
# Opt level: O1

string * __thiscall
henson::CommandLine::executable(string *__return_storage_ptr__,CommandLine *this,string *prefix)

{
  char cVar1;
  pointer pvVar2;
  undefined8 uVar3;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pvVar2 = (this->arguments).
           super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = *(undefined8 *)&(pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl;
  pcVar4 = *(pointer *)
            ((long)&(pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
            ((string *)__return_storage_ptr__,uVar3,pcVar4 + -1);
  cVar1 = *(__return_storage_ptr__->_M_dataplus)._M_p;
  if ((cVar1 != '/') && (cVar1 != '~')) {
    std::operator+(&local_38,prefix,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string                 executable(std::string prefix = "") const
    {
        auto exec = std::string(arguments[0].begin(), arguments[0].end() - 1);
        if (exec[0] != '/' && exec[0] != '~')
            exec = prefix + exec;
        return exec;
    }